

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::maxwell_dist<float>::icdf(maxwell_dist<float> *this,result_type_conflict1 x)

{
  int *piVar1;
  int __x;
  maxwell_dist<float> *in_RDI;
  float in_XMM0_Da;
  result_type_conflict1 rVar2;
  float fVar3;
  float extraout_XMM0_Da;
  result_type_conflict1 y_old;
  int i;
  result_type_conflict1 y;
  undefined4 local_1c;
  undefined4 local_18;
  maxwell_dist<float> *this_00;
  undefined4 local_4;
  
  if ((in_XMM0_Da < 0.0) || (1.0 < in_XMM0_Da)) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    local_4 = std::numeric_limits<float>::quiet_NaN();
  }
  else if ((in_XMM0_Da != 1.0) || (NAN(in_XMM0_Da))) {
    if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
      this_00 = in_RDI;
      rVar2 = param_type::theta(&in_RDI->P);
      local_18 = rVar2 * 2.0 * 0.7978846;
      for (local_1c = 0; local_1c < 0x1a; local_1c = local_1c + 1) {
        rVar2 = cdf(this_00,in_XMM0_Da);
        __x = (int)in_RDI;
        fVar3 = rVar2 - in_XMM0_Da;
        rVar2 = pdf(this_00,in_XMM0_Da);
        local_18 = local_18 - fVar3 / rVar2;
        Catch::clara::std::abs(__x);
        fVar3 = Catch::clara::std::numeric_limits<float>::epsilon();
        if (extraout_XMM0_Da < fVar3 * 4.0) break;
      }
      local_4 = local_18;
    }
    else {
      local_4 = 0.0;
    }
  }
  else {
    local_4 = std::numeric_limits<float>::infinity();
  }
  return local_4;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      if (x == 1)
        return math::numeric_limits<result_type>::infinity();
      if (x == 0)
        return 0;
      result_type y(2 * P.theta() * math::constants<result_type>::sqrt_2_over_pi);
      for (int i{0}; i < math::numeric_limits<result_type>::digits + 2; ++i) {
        result_type y_old = y;
        y -= (cdf(y) - x) / pdf(y);
        if (math::abs(y / y_old - 1) < 4 * math::numeric_limits<result_type>::epsilon())
          break;
      }
      return y;
    }